

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O1

void __thiscall Assimp::ColladaExporter::WriteMaterials(ColladaExporter *this)

{
  undefined8 *puVar1;
  undefined1 *puVar2;
  Surface *pSurface;
  string *data;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  Surface *pSVar4;
  size_t __n;
  size_type sVar5;
  size_type sVar6;
  size_type sVar7;
  size_type sVar8;
  size_type sVar9;
  size_type sVar10;
  pointer pcVar11;
  bool bVar12;
  aiReturn aVar13;
  int iVar14;
  aiScene *paVar15;
  undefined8 *puVar16;
  size_t sVar17;
  long *plVar18;
  void *pvVar19;
  ostream *poVar20;
  undefined4 uVar21;
  ulong uVar22;
  char *pcVar23;
  char *pcVar24;
  long lVar25;
  _Alloc_hider _Var26;
  long lVar27;
  vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
  *this_00;
  ulong *puVar28;
  pointer pMVar29;
  string *psVar30;
  ulong uVar31;
  Property *pProperty;
  long lVar32;
  Material *mat;
  long lVar33;
  string testName;
  aiString name;
  aiMaterialProperty *prop;
  undefined8 *local_660;
  undefined8 local_658;
  undefined8 local_650;
  undefined8 uStack_648;
  ulong *local_640;
  long local_638;
  ulong local_630 [2];
  ulong *local_620;
  long local_618;
  ulong local_610 [2];
  Surface *local_600;
  ulong *local_5f8;
  size_t local_5f0;
  ulong local_5e8;
  long lStack_5e0;
  ColladaExporter *local_5d8;
  Surface *local_5d0;
  Surface *local_5c8;
  Surface *local_5c0;
  Surface *local_5b8;
  aiString local_5b0;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  this_00 = &this->materials;
  std::vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
  ::resize(this_00,(ulong)this->mScene->mNumMaterials);
  paVar15 = this->mScene;
  if (paVar15->mNumMaterials != 0) {
    lVar27 = 0;
    lVar32 = 0;
    uVar31 = 0;
    local_5d8 = this;
    do {
      pSVar4 = (Surface *)paVar15->mMaterials[uVar31];
      local_5b0._0_8_ = local_5b0._0_8_ & 0xffffff0000000000;
      memset((void *)((long)&local_5b0 + 5),0x1b,0x3ff);
      local_600 = pSVar4;
      aVar13 = aiGetMaterialString((aiMaterial *)pSVar4,"?mat.name",0,0,&local_5b0);
      if (aVar13 == aiReturn_SUCCESS) {
        lVar33 = (long)&local_5b0 + 4;
        local_5f8 = &local_5e8;
        sVar17 = strlen((char *)lVar33);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_5f8,lVar33,lVar33 + sVar17)
        ;
        sVar17 = local_5f0;
        puVar28 = local_5f8;
        if (uVar31 == 0) {
          lVar33 = 0;
        }
        else {
          pMVar29 = (this_00->
                    super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          lVar25 = 0;
          lVar33 = 0;
          do {
            __n = *(size_t *)((long)&(pMVar29->name)._M_string_length + lVar25);
            if (__n == sVar17) {
              if (__n == 0) {
                uVar22 = 1;
              }
              else {
                iVar14 = bcmp(*(void **)((long)&(pMVar29->name)._M_dataplus._M_p + lVar25),puVar28,
                              __n);
                uVar22 = (ulong)(iVar14 == 0);
              }
            }
            else {
              uVar22 = 0;
            }
            lVar33 = lVar33 + uVar22;
            lVar25 = lVar25 + 0x218;
          } while (lVar27 != lVar25);
        }
        if (lVar33 == 0) {
          pMVar29 = (this_00->
                    super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pcVar24 = (char *)pMVar29[uVar31].name._M_string_length;
          strlen((char *)((long)&local_5b0 + 4));
          std::__cxx11::string::_M_replace((ulong)(pMVar29 + uVar31),0,pcVar24,(long)&local_5b0 + 4)
          ;
        }
        else {
          lVar33 = (long)&local_5b0 + 4;
          local_620 = local_610;
          sVar17 = strlen((char *)lVar33);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_620,lVar33,lVar33 + sVar17);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          uVar22 = 0xf;
          if (local_620 != local_610) {
            uVar22 = local_610[0];
          }
          if (uVar22 < (ulong)(local_638 + local_618)) {
            uVar22 = 0xf;
            if (local_640 != local_630) {
              uVar22 = local_630[0];
            }
            if (uVar22 < (ulong)(local_638 + local_618)) goto LAB_00314141;
            puVar16 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_640,0,(char *)0x0,(ulong)local_620);
          }
          else {
LAB_00314141:
            puVar16 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_620,(ulong)local_640);
          }
          puVar1 = puVar16 + 2;
          if ((undefined8 *)*puVar16 == puVar1) {
            local_650 = *puVar1;
            uStack_648 = puVar16[3];
            local_660 = &local_650;
          }
          else {
            local_650 = *puVar1;
            local_660 = (undefined8 *)*puVar16;
          }
          local_658 = puVar16[1];
          *puVar16 = puVar1;
          puVar16[1] = 0;
          *(undefined1 *)puVar1 = 0;
          std::__cxx11::string::operator=
                    ((string *)
                     ((this_00->
                      super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                      )._M_impl.super__Vector_impl_data._M_start + uVar31),(string *)&local_660);
          if (local_660 != &local_650) {
            operator_delete(local_660);
          }
          if (local_640 != local_630) {
            operator_delete(local_640);
          }
          if (local_620 != local_610) {
            operator_delete(local_620);
          }
        }
        puVar28 = local_5f8;
        if (local_5f8 != &local_5e8) goto LAB_00313f5a;
      }
      else {
        local_5b0._0_8_ = (char *)0x74616d00000003;
        local_620 = local_610;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_620,"m","");
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        uVar22 = 0xf;
        if (local_620 != local_610) {
          uVar22 = local_610[0];
        }
        if (uVar22 < (ulong)(local_638 + local_618)) {
          uVar22 = 0xf;
          if (local_640 != local_630) {
            uVar22 = local_630[0];
          }
          if (uVar22 < (ulong)(local_638 + local_618)) goto LAB_00313d96;
          puVar16 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_640,0,(char *)0x0,(ulong)local_620);
        }
        else {
LAB_00313d96:
          puVar16 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_620,(ulong)local_640);
        }
        puVar1 = puVar16 + 2;
        if ((undefined8 *)*puVar16 == puVar1) {
          local_650 = *puVar1;
          uStack_648 = puVar16[3];
          local_660 = &local_650;
        }
        else {
          local_650 = *puVar1;
          local_660 = (undefined8 *)*puVar16;
        }
        local_658 = puVar16[1];
        *puVar16 = puVar1;
        puVar16[1] = 0;
        *(undefined1 *)puVar1 = 0;
        plVar18 = (long *)std::__cxx11::string::append((char *)&local_660);
        puVar28 = (ulong *)(plVar18 + 2);
        if ((ulong *)*plVar18 == puVar28) {
          local_5e8 = *puVar28;
          lStack_5e0 = plVar18[3];
          local_5f8 = &local_5e8;
        }
        else {
          local_5e8 = *puVar28;
          local_5f8 = (ulong *)*plVar18;
        }
        local_5f0 = plVar18[1];
        *plVar18 = (long)puVar28;
        plVar18[1] = 0;
        *(undefined1 *)(plVar18 + 2) = 0;
        std::__cxx11::string::operator=
                  ((string *)
                   ((this_00->
                    super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                    )._M_impl.super__Vector_impl_data._M_start + uVar31),(string *)&local_5f8);
        if (local_5f8 != &local_5e8) {
          operator_delete(local_5f8);
        }
        if (local_660 != &local_650) {
          operator_delete(local_660);
        }
        if (local_640 != local_630) {
          operator_delete(local_640);
        }
        puVar28 = local_620;
        if (local_620 != local_610) {
LAB_00313f5a:
          operator_delete(puVar28);
        }
      }
      pMVar29 = (this_00->
                super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if (pMVar29[uVar31].name._M_string_length != 0) {
        _Var26._M_p = pMVar29[uVar31].name._M_dataplus._M_p;
        do {
          pvVar19 = memchr("0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz",
                           (int)*_Var26._M_p,0x3f);
          if (pvVar19 == (void *)0x0) {
            *_Var26._M_p = '_';
          }
          _Var26._M_p = _Var26._M_p + 1;
          pMVar29 = (this_00->
                    super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                    )._M_impl.super__Vector_impl_data._M_start;
        } while (_Var26._M_p !=
                 pMVar29[uVar31].name._M_dataplus._M_p + pMVar29[uVar31].name._M_string_length);
      }
      bVar12 = false;
      std::__cxx11::string::_M_replace
                ((ulong)&pMVar29[uVar31].shading_model,0,
                 (char *)pMVar29[uVar31].shading_model._M_string_length,0x703797);
      aVar13 = aiGetMaterialProperty
                         ((aiMaterial *)local_600,"$mat.shadingm",0,0,
                          (aiMaterialProperty **)local_1a8);
      uVar21 = 1;
      if (aVar13 == aiReturn_SUCCESS) {
        if ((*(uint *)(local_1a8[0]._M_dataplus._M_p + 0x40c) < 4) ||
           (*(int *)(local_1a8[0]._M_dataplus._M_p + 0x410) != 5)) {
          bVar12 = false;
        }
        else {
          uVar21 = **(undefined4 **)(local_1a8[0]._M_dataplus._M_p + 0x418);
          bVar12 = true;
        }
      }
      if (bVar12) {
        switch(uVar21) {
        case 2:
          pMVar29 = (this_00->
                    super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          psVar30 = &pMVar29[uVar31].shading_model;
          pcVar24 = (char *)pMVar29[uVar31].shading_model._M_string_length;
          pcVar23 = "lambert";
          break;
        case 3:
          pMVar29 = (this_00->
                    super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          psVar30 = &pMVar29[uVar31].shading_model;
          pcVar24 = (char *)pMVar29[uVar31].shading_model._M_string_length;
          pcVar23 = "phong";
          break;
        case 4:
          pMVar29 = (this_00->
                    super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          psVar30 = &pMVar29[uVar31].shading_model;
          pcVar24 = (char *)pMVar29[uVar31].shading_model._M_string_length;
          pcVar23 = "blinn";
          break;
        default:
          goto switchD_00314044_caseD_5;
        case 9:
          pMVar29 = (this_00->
                    super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          psVar30 = &pMVar29[uVar31].shading_model;
          pcVar24 = (char *)pMVar29[uVar31].shading_model._M_string_length;
          pcVar23 = "constant";
        }
        std::__cxx11::string::_M_replace((ulong)psVar30,0,pcVar24,(ulong)pcVar23);
      }
switchD_00314044_caseD_5:
      this = local_5d8;
      pSVar4 = local_600;
      ReadMaterialSurface(local_5d8,
                          &(local_5d8->materials).
                           super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar31].ambient,
                          (aiMaterial *)local_600,aiTextureType_AMBIENT,"$clr.ambient",0,0);
      pMVar29 = (this->materials).
                super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                ._M_impl.super__Vector_impl_data._M_start;
      sVar5 = pMVar29[uVar31].ambient.texture._M_string_length;
      ReadMaterialSurface(this,&pMVar29[uVar31].diffuse,(aiMaterial *)pSVar4,aiTextureType_DIFFUSE,
                          "$clr.diffuse",0,0);
      pMVar29 = (this->materials).
                super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                ._M_impl.super__Vector_impl_data._M_start;
      sVar6 = pMVar29[uVar31].diffuse.texture._M_string_length;
      ReadMaterialSurface(this,&pMVar29[uVar31].specular,(aiMaterial *)pSVar4,aiTextureType_SPECULAR
                          ,"$clr.specular",0,0);
      pMVar29 = (this->materials).
                super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                ._M_impl.super__Vector_impl_data._M_start;
      sVar7 = pMVar29[uVar31].specular.texture._M_string_length;
      ReadMaterialSurface(this,&pMVar29[uVar31].emissive,(aiMaterial *)pSVar4,aiTextureType_EMISSIVE
                          ,"$clr.emissive",0,0);
      pMVar29 = (this->materials).
                super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                ._M_impl.super__Vector_impl_data._M_start;
      sVar8 = pMVar29[uVar31].emissive.texture._M_string_length;
      ReadMaterialSurface(this,&pMVar29[uVar31].reflective,(aiMaterial *)pSVar4,
                          aiTextureType_REFLECTION,"$clr.reflective",0,0);
      pMVar29 = (this->materials).
                super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                ._M_impl.super__Vector_impl_data._M_start;
      sVar9 = pMVar29[uVar31].reflective.texture._M_string_length;
      ReadMaterialSurface(this,&pMVar29[uVar31].transparent,(aiMaterial *)pSVar4,
                          aiTextureType_OPACITY,"$clr.transparent",0,0);
      pMVar29 = (this->materials).
                super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                ._M_impl.super__Vector_impl_data._M_start;
      sVar10 = pMVar29[uVar31].transparent.texture._M_string_length;
      ReadMaterialSurface(this,&pMVar29[uVar31].normal,(aiMaterial *)pSVar4,aiTextureType_NORMALS,
                          (char *)0x0,0,0);
      pMVar29 = (this->materials).
                super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar32 = (((((((lVar32 - (ulong)(sVar5 == 0)) - (ulong)(sVar6 == 0)) - (ulong)(sVar7 == 0)) -
                  (ulong)(sVar8 == 0)) - (ulong)(sVar9 == 0)) - (ulong)(sVar10 == 0)) + 7) -
               (ulong)(pMVar29[uVar31].normal.texture._M_string_length == 0);
      aVar13 = aiGetMaterialFloatArray
                         ((aiMaterial *)pSVar4,"$mat.shininess",0,0,&pMVar29[uVar31].shininess.value
                          ,(uint *)0x0);
      (this->materials).
      super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar31].shininess.exist = aVar13 == aiReturn_SUCCESS
      ;
      aVar13 = aiGetMaterialFloatArray
                         ((aiMaterial *)pSVar4,"$mat.opacity",0,0,
                          &(this->materials).
                           super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar31].transparency.value,
                          (uint *)0x0);
      (this->materials).
      super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar31].transparency.exist =
           aVar13 == aiReturn_SUCCESS;
      aVar13 = aiGetMaterialFloatArray
                         ((aiMaterial *)pSVar4,"$mat.refracti",0,0,
                          &(this->materials).
                           super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar31].index_refraction.value,
                          (uint *)0x0);
      (this->materials).
      super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar31].index_refraction.exist =
           aVar13 == aiReturn_SUCCESS;
      uVar31 = uVar31 + 1;
      paVar15 = this->mScene;
      lVar27 = lVar27 + 0x218;
    } while (uVar31 < paVar15->mNumMaterials);
    if (lVar32 != 0) {
      poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&this->field_0x38,(this->startstr)._M_dataplus._M_p,
                           (this->startstr)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar20,"<library_images>",0x10);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar20,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
      std::__cxx11::string::append((char *)&this->startstr);
      pMVar29 = (this->materials).
                super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (pMVar29 !=
          (this->materials).
          super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        puVar16 = (undefined8 *)(local_5b0.data + 0xc);
        do {
          pcVar11 = (pMVar29->name)._M_dataplus._M_p;
          local_5b0._0_8_ = puVar16;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_5b0,pcVar11,pcVar11 + (pMVar29->name)._M_string_length);
          std::__cxx11::string::append((char *)&local_5b0);
          WriteImageEntry(this,&pMVar29->ambient,(string *)&local_5b0);
          if ((undefined8 *)local_5b0._0_8_ != puVar16) {
            operator_delete((void *)local_5b0._0_8_);
          }
          pcVar11 = (pMVar29->name)._M_dataplus._M_p;
          local_5b0._0_8_ = puVar16;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_5b0,pcVar11,pcVar11 + (pMVar29->name)._M_string_length);
          std::__cxx11::string::append((char *)&local_5b0);
          WriteImageEntry(this,&pMVar29->diffuse,(string *)&local_5b0);
          if ((undefined8 *)local_5b0._0_8_ != puVar16) {
            operator_delete((void *)local_5b0._0_8_);
          }
          pcVar11 = (pMVar29->name)._M_dataplus._M_p;
          local_5b0._0_8_ = puVar16;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_5b0,pcVar11,pcVar11 + (pMVar29->name)._M_string_length);
          std::__cxx11::string::append((char *)&local_5b0);
          WriteImageEntry(this,&pMVar29->specular,(string *)&local_5b0);
          if ((undefined8 *)local_5b0._0_8_ != puVar16) {
            operator_delete((void *)local_5b0._0_8_);
          }
          pcVar11 = (pMVar29->name)._M_dataplus._M_p;
          local_5b0._0_8_ = puVar16;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_5b0,pcVar11,pcVar11 + (pMVar29->name)._M_string_length);
          std::__cxx11::string::append((char *)&local_5b0);
          WriteImageEntry(this,&pMVar29->emissive,(string *)&local_5b0);
          if ((undefined8 *)local_5b0._0_8_ != puVar16) {
            operator_delete((void *)local_5b0._0_8_);
          }
          pcVar11 = (pMVar29->name)._M_dataplus._M_p;
          local_5b0._0_8_ = puVar16;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_5b0,pcVar11,pcVar11 + (pMVar29->name)._M_string_length);
          std::__cxx11::string::append((char *)&local_5b0);
          WriteImageEntry(this,&pMVar29->reflective,(string *)&local_5b0);
          if ((undefined8 *)local_5b0._0_8_ != puVar16) {
            operator_delete((void *)local_5b0._0_8_);
          }
          pcVar11 = (pMVar29->name)._M_dataplus._M_p;
          local_5b0._0_8_ = puVar16;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_5b0,pcVar11,pcVar11 + (pMVar29->name)._M_string_length);
          std::__cxx11::string::append((char *)&local_5b0);
          WriteImageEntry(this,&pMVar29->transparent,(string *)&local_5b0);
          if ((undefined8 *)local_5b0._0_8_ != puVar16) {
            operator_delete((void *)local_5b0._0_8_);
          }
          pcVar11 = (pMVar29->name)._M_dataplus._M_p;
          local_5b0._0_8_ = puVar16;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_5b0,pcVar11,pcVar11 + (pMVar29->name)._M_string_length);
          std::__cxx11::string::append((char *)&local_5b0);
          WriteImageEntry(this,&pMVar29->normal,(string *)&local_5b0);
          if ((undefined8 *)local_5b0._0_8_ != puVar16) {
            operator_delete((void *)local_5b0._0_8_);
          }
          pMVar29 = pMVar29 + 1;
        } while (pMVar29 !=
                 (this->materials).
                 super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      PopTag(this);
      poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&this->field_0x38,(this->startstr)._M_dataplus._M_p,
                           (this->startstr)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar20,"</library_images>",0x11);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar20,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
    }
  }
  if ((this->materials).
      super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->materials).
      super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    puVar2 = &this->field_0x38;
    psVar30 = &this->startstr;
    poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)puVar2,(this->startstr)._M_dataplus._M_p,
                         (this->startstr)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar20,"<library_effects>",0x11);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar20,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
    std::__cxx11::string::append((char *)psVar30);
    pMVar29 = (this->materials).
              super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (pMVar29 !=
        (this->materials).
        super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pProperty = &pMVar29->index_refraction;
      do {
        data = (string *)(pProperty + -0x42);
        poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)puVar2,(this->startstr)._M_dataplus._M_p,
                             (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar20,"<effect id=\"",0xc);
        XMLEscape((string *)&local_5b0,data);
        poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar20,(char *)local_5b0._0_8_,local_5b0.data._4_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar20,"-fx\" name=\"",0xb);
        XMLEscape(local_1a8,data);
        poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar20,local_1a8[0]._M_dataplus._M_p,local_1a8[0]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\">",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar20,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
          operator_delete(local_1a8[0]._M_dataplus._M_p);
        }
        if ((char *)local_5b0._0_8_ != local_5b0.data + 0xc) {
          operator_delete((void *)local_5b0._0_8_);
        }
        std::__cxx11::string::append((char *)psVar30);
        poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)puVar2,(this->startstr)._M_dataplus._M_p,
                             (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar20,"<profile_COMMON>",0x10);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar20,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        std::__cxx11::string::append((char *)psVar30);
        local_5b0._0_8_ = local_5b0.data + 0xc;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b0,"emission","");
        WriteTextureParamEntry(this,(Surface *)(pProperty + -0x22),(string *)&local_5b0,data);
        if ((char *)local_5b0._0_8_ != local_5b0.data + 0xc) {
          operator_delete((void *)local_5b0._0_8_);
        }
        local_5b0._0_8_ = local_5b0.data + 0xc;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b0,"ambient","");
        local_600 = (Surface *)(pProperty + -0x3a);
        WriteTextureParamEntry(this,local_600,(string *)&local_5b0,data);
        if ((char *)local_5b0._0_8_ != local_5b0.data + 0xc) {
          operator_delete((void *)local_5b0._0_8_);
        }
        local_5b0._0_8_ = local_5b0.data + 0xc;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b0,"diffuse","");
        local_5d8 = (ColladaExporter *)(pProperty + -0x32);
        WriteTextureParamEntry(this,(Surface *)local_5d8,(string *)&local_5b0,data);
        if ((char *)local_5b0._0_8_ != local_5b0.data + 0xc) {
          operator_delete((void *)local_5b0._0_8_);
        }
        local_5b0._0_8_ = local_5b0.data + 0xc;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b0,"specular","");
        local_5b8 = (Surface *)(pProperty + -0x2a);
        WriteTextureParamEntry(this,local_5b8,(string *)&local_5b0,data);
        if ((char *)local_5b0._0_8_ != local_5b0.data + 0xc) {
          operator_delete((void *)local_5b0._0_8_);
        }
        local_5b0._0_8_ = local_5b0.data + 0xc;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b0,"reflective","");
        local_5c0 = (Surface *)(pProperty + -0x1a);
        WriteTextureParamEntry(this,local_5c0,(string *)&local_5b0,data);
        if ((char *)local_5b0._0_8_ != local_5b0.data + 0xc) {
          operator_delete((void *)local_5b0._0_8_);
        }
        local_5b0._0_8_ = local_5b0.data + 0xc;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b0,"transparent","");
        pSVar4 = (Surface *)(pProperty + -0x12);
        WriteTextureParamEntry(this,pSVar4,(string *)&local_5b0,data);
        if ((char *)local_5b0._0_8_ != local_5b0.data + 0xc) {
          operator_delete((void *)local_5b0._0_8_);
        }
        local_5b0._0_8_ = local_5b0.data + 0xc;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b0,"normal","");
        pSurface = (Surface *)(pProperty + -10);
        WriteTextureParamEntry(this,pSurface,(string *)&local_5b0,data);
        local_5d0 = pSurface;
        local_5c8 = pSVar4;
        if ((char *)local_5b0._0_8_ != local_5b0.data + 0xc) {
          operator_delete((void *)local_5b0._0_8_);
        }
        poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)puVar2,(this->startstr)._M_dataplus._M_p,
                             (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar20,"<technique sid=\"standard\">",0x1a);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar20,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        std::__cxx11::string::append((char *)psVar30);
        poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)puVar2,(this->startstr)._M_dataplus._M_p,
                             (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar20,"<",1);
        poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar20,(char *)pProperty[-0x3e],(long)pProperty[-0x3d]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar20,">",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar20,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        std::__cxx11::string::append((char *)psVar30);
        local_5b0._0_8_ = local_5b0.data + 0xc;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b0,"emission","");
        paVar3 = &local_1a8[0].field_2;
        local_1a8[0]._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1a8,pProperty[-0x42],
                   (long)pProperty[-0x41] + (long)pProperty[-0x42]);
        std::__cxx11::string::append((char *)local_1a8);
        WriteTextureColorEntry(this,(Surface *)(pProperty + -0x22),(string *)&local_5b0,local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p != paVar3) {
          operator_delete(local_1a8[0]._M_dataplus._M_p);
        }
        if ((char *)local_5b0._0_8_ != local_5b0.data + 0xc) {
          operator_delete((void *)local_5b0._0_8_);
        }
        local_5b0._0_8_ = local_5b0.data + 0xc;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b0,"ambient","");
        local_1a8[0]._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1a8,pProperty[-0x42],
                   (long)pProperty[-0x41] + (long)pProperty[-0x42]);
        std::__cxx11::string::append((char *)local_1a8);
        WriteTextureColorEntry(this,local_600,(string *)&local_5b0,local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p != paVar3) {
          operator_delete(local_1a8[0]._M_dataplus._M_p);
        }
        if ((char *)local_5b0._0_8_ != local_5b0.data + 0xc) {
          operator_delete((void *)local_5b0._0_8_);
        }
        local_5b0._0_8_ = local_5b0.data + 0xc;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b0,"diffuse","");
        local_1a8[0]._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1a8,pProperty[-0x42],
                   (long)pProperty[-0x41] + (long)pProperty[-0x42]);
        std::__cxx11::string::append((char *)local_1a8);
        WriteTextureColorEntry(this,(Surface *)local_5d8,(string *)&local_5b0,local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p != paVar3) {
          operator_delete(local_1a8[0]._M_dataplus._M_p);
        }
        if ((char *)local_5b0._0_8_ != local_5b0.data + 0xc) {
          operator_delete((void *)local_5b0._0_8_);
        }
        local_5b0._0_8_ = local_5b0.data + 0xc;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b0,"specular","");
        local_1a8[0]._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1a8,pProperty[-0x42],
                   (long)pProperty[-0x41] + (long)pProperty[-0x42]);
        std::__cxx11::string::append((char *)local_1a8);
        WriteTextureColorEntry(this,local_5b8,(string *)&local_5b0,local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p != paVar3) {
          operator_delete(local_1a8[0]._M_dataplus._M_p);
        }
        if ((char *)local_5b0._0_8_ != local_5b0.data + 0xc) {
          operator_delete((void *)local_5b0._0_8_);
        }
        local_5b0._0_8_ = local_5b0.data + 0xc;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b0,"shininess","");
        WriteFloatEntry(this,pProperty + -2,(string *)&local_5b0);
        if ((char *)local_5b0._0_8_ != local_5b0.data + 0xc) {
          operator_delete((void *)local_5b0._0_8_);
        }
        local_5b0._0_8_ = local_5b0.data + 0xc;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b0,"reflective","");
        local_1a8[0]._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1a8,pProperty[-0x42],
                   (long)pProperty[-0x41] + (long)pProperty[-0x42]);
        std::__cxx11::string::append((char *)local_1a8);
        WriteTextureColorEntry(this,local_5c0,(string *)&local_5b0,local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p != paVar3) {
          operator_delete(local_1a8[0]._M_dataplus._M_p);
        }
        if ((char *)local_5b0._0_8_ != local_5b0.data + 0xc) {
          operator_delete((void *)local_5b0._0_8_);
        }
        local_5b0._0_8_ = local_5b0.data + 0xc;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b0,"transparent","");
        local_1a8[0]._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1a8,pProperty[-0x42],
                   (long)pProperty[-0x41] + (long)pProperty[-0x42]);
        std::__cxx11::string::append((char *)local_1a8);
        WriteTextureColorEntry(this,local_5c8,(string *)&local_5b0,local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p != paVar3) {
          operator_delete(local_1a8[0]._M_dataplus._M_p);
        }
        if ((char *)local_5b0._0_8_ != local_5b0.data + 0xc) {
          operator_delete((void *)local_5b0._0_8_);
        }
        local_5b0._0_8_ = local_5b0.data + 0xc;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b0,"transparency","");
        WriteFloatEntry(this,pProperty + -1,(string *)&local_5b0);
        if ((char *)local_5b0._0_8_ != local_5b0.data + 0xc) {
          operator_delete((void *)local_5b0._0_8_);
        }
        local_5b0._0_8_ = local_5b0.data + 0xc;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_5b0,"index_of_refraction","");
        WriteFloatEntry(this,pProperty,(string *)&local_5b0);
        if ((char *)local_5b0._0_8_ != local_5b0.data + 0xc) {
          operator_delete((void *)local_5b0._0_8_);
        }
        if (pProperty[-6] != (Property)0x0) {
          local_5b0._0_8_ = local_5b0.data + 0xc;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b0,"bump","");
          local_1a8[0]._M_dataplus._M_p = (pointer)paVar3;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1a8,pProperty[-0x42],
                     (long)pProperty[-0x41] + (long)pProperty[-0x42]);
          std::__cxx11::string::append((char *)local_1a8);
          WriteTextureColorEntry(this,local_5d0,(string *)&local_5b0,local_1a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8[0]._M_dataplus._M_p != paVar3) {
            operator_delete(local_1a8[0]._M_dataplus._M_p);
          }
          if ((char *)local_5b0._0_8_ != local_5b0.data + 0xc) {
            operator_delete((void *)local_5b0._0_8_);
          }
        }
        PopTag(this);
        poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)puVar2,(this->startstr)._M_dataplus._M_p,
                             (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar20,"</",2);
        poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar20,(char *)pProperty[-0x3e],(long)pProperty[-0x3d]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar20,">",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar20,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        PopTag(this);
        poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)puVar2,(this->startstr)._M_dataplus._M_p,
                             (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar20,"</technique>",0xc);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar20,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        PopTag(this);
        poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)puVar2,(this->startstr)._M_dataplus._M_p,
                             (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar20,"</profile_COMMON>",0x11);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar20,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        PopTag(this);
        poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)puVar2,(this->startstr)._M_dataplus._M_p,
                             (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar20,"</effect>",9);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar20,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        pMVar29 = (pointer)(pProperty + 1);
        pProperty = pProperty + 0x43;
      } while (pMVar29 !=
               (this->materials).
               super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    PopTag(this);
    poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)puVar2,(this->startstr)._M_dataplus._M_p,
                         (this->startstr)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar20,"</library_effects>",0x12);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar20,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
    poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)puVar2,(this->startstr)._M_dataplus._M_p,
                         (this->startstr)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar20,"<library_materials>",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar20,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
    std::__cxx11::string::append((char *)psVar30);
    pMVar29 = (this->materials).
              super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (pMVar29 !=
        (this->materials).
        super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)puVar2,(this->startstr)._M_dataplus._M_p,
                             (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar20,"<material id=\"",0xe);
        XMLEscape((string *)&local_5b0,&pMVar29->name);
        poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar20,(char *)local_5b0._0_8_,local_5b0.data._4_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\" name=\"",8);
        poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar20,(pMVar29->name)._M_dataplus._M_p,
                             (pMVar29->name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\">",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar20,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        if ((char *)local_5b0._0_8_ != local_5b0.data + 0xc) {
          operator_delete((void *)local_5b0._0_8_);
        }
        std::__cxx11::string::append((char *)psVar30);
        poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)puVar2,(this->startstr)._M_dataplus._M_p,
                             (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar20,"<instance_effect url=\"#",0x17);
        XMLEscape((string *)&local_5b0,&pMVar29->name);
        poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar20,(char *)local_5b0._0_8_,local_5b0.data._4_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar20,"-fx\"/>",6);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar20,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        if ((char *)local_5b0._0_8_ != local_5b0.data + 0xc) {
          operator_delete((void *)local_5b0._0_8_);
        }
        PopTag(this);
        poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)puVar2,(this->startstr)._M_dataplus._M_p,
                             (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar20,"</material>",0xb);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar20,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        pMVar29 = pMVar29 + 1;
      } while (pMVar29 !=
               (this->materials).
               super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    PopTag(this);
    poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)puVar2,(this->startstr)._M_dataplus._M_p,
                         (this->startstr)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar20,"</library_materials>",0x14);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar20,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  }
  return;
}

Assistant:

void ColladaExporter::WriteMaterials()
{
  materials.resize( mScene->mNumMaterials);

  /// collect all materials from the scene
  size_t numTextures = 0;
  for( size_t a = 0; a < mScene->mNumMaterials; ++a )
  {
    const aiMaterial* mat = mScene->mMaterials[a];

    aiString name;
    if( mat->Get( AI_MATKEY_NAME, name) != aiReturn_SUCCESS ) {
      name = "mat";
      materials[a].name = std::string( "m") + to_string(a) + name.C_Str();
    } else {
      // try to use the material's name if no other material has already taken it, else append #
      std::string testName = name.C_Str();
      size_t materialCountWithThisName = 0;
      for( size_t i = 0; i < a; i ++ ) {
        if( materials[i].name == testName ) {
          materialCountWithThisName ++;
        }
      }
      if( materialCountWithThisName == 0 ) {
        materials[a].name = name.C_Str();
      } else {
        materials[a].name = std::string(name.C_Str()) + to_string(materialCountWithThisName);
      }
    }
    for( std::string::iterator it = materials[a].name.begin(); it != materials[a].name.end(); ++it ) {
      if( !isalnum_C( *it ) ) {
        *it = '_';
      }
    }

    aiShadingMode shading = aiShadingMode_Flat;
    materials[a].shading_model = "phong";
    if(mat->Get( AI_MATKEY_SHADING_MODEL, shading) == aiReturn_SUCCESS) {
        if(shading == aiShadingMode_Phong) {
            materials[a].shading_model = "phong";
        } else if(shading == aiShadingMode_Blinn) {
            materials[a].shading_model = "blinn";
        } else if(shading == aiShadingMode_NoShading) {
            materials[a].shading_model = "constant";
        } else if(shading == aiShadingMode_Gouraud) {
            materials[a].shading_model = "lambert";
        }
    }

    ReadMaterialSurface( materials[a].ambient, mat, aiTextureType_AMBIENT, AI_MATKEY_COLOR_AMBIENT);
    if( !materials[a].ambient.texture.empty() ) numTextures++;
    ReadMaterialSurface( materials[a].diffuse, mat, aiTextureType_DIFFUSE, AI_MATKEY_COLOR_DIFFUSE);
    if( !materials[a].diffuse.texture.empty() ) numTextures++;
    ReadMaterialSurface( materials[a].specular, mat, aiTextureType_SPECULAR, AI_MATKEY_COLOR_SPECULAR);
    if( !materials[a].specular.texture.empty() ) numTextures++;
    ReadMaterialSurface( materials[a].emissive, mat, aiTextureType_EMISSIVE, AI_MATKEY_COLOR_EMISSIVE);
    if( !materials[a].emissive.texture.empty() ) numTextures++;
    ReadMaterialSurface( materials[a].reflective, mat, aiTextureType_REFLECTION, AI_MATKEY_COLOR_REFLECTIVE);
    if( !materials[a].reflective.texture.empty() ) numTextures++;
    ReadMaterialSurface( materials[a].transparent, mat, aiTextureType_OPACITY, AI_MATKEY_COLOR_TRANSPARENT);
    if( !materials[a].transparent.texture.empty() ) numTextures++;
    ReadMaterialSurface( materials[a].normal, mat, aiTextureType_NORMALS, NULL, 0, 0);
    if( !materials[a].normal.texture.empty() ) numTextures++;

    materials[a].shininess.exist = mat->Get( AI_MATKEY_SHININESS, materials[a].shininess.value) == aiReturn_SUCCESS;
    materials[a].transparency.exist = mat->Get( AI_MATKEY_OPACITY, materials[a].transparency.value) == aiReturn_SUCCESS;
    materials[a].index_refraction.exist = mat->Get( AI_MATKEY_REFRACTI, materials[a].index_refraction.value) == aiReturn_SUCCESS;
  }

  // output textures if present
  if( numTextures > 0 )
  {
    mOutput << startstr << "<library_images>" << endstr;
    PushTag();
    for( std::vector<Material>::const_iterator it = materials.begin(); it != materials.end(); ++it )
    {
      const Material& mat = *it;
      WriteImageEntry( mat.ambient, mat.name + "-ambient-image");
      WriteImageEntry( mat.diffuse, mat.name + "-diffuse-image");
      WriteImageEntry( mat.specular, mat.name + "-specular-image");
      WriteImageEntry( mat.emissive, mat.name + "-emission-image");
      WriteImageEntry( mat.reflective, mat.name + "-reflective-image");
      WriteImageEntry( mat.transparent, mat.name + "-transparent-image");
      WriteImageEntry( mat.normal, mat.name + "-normal-image");
    }
    PopTag();
    mOutput << startstr << "</library_images>" << endstr;
  }

  // output effects - those are the actual carriers of information
  if( !materials.empty() )
  {
    mOutput << startstr << "<library_effects>" << endstr;
    PushTag();
    for( std::vector<Material>::const_iterator it = materials.begin(); it != materials.end(); ++it )
    {
      const Material& mat = *it;
      // this is so ridiculous it must be right
      mOutput << startstr << "<effect id=\"" << XMLEscape(mat.name) << "-fx\" name=\"" << XMLEscape(mat.name) << "\">" << endstr;
      PushTag();
      mOutput << startstr << "<profile_COMMON>" << endstr;
      PushTag();

      // write sampler- and surface params for the texture entries
      WriteTextureParamEntry( mat.emissive, "emission", mat.name);
      WriteTextureParamEntry( mat.ambient, "ambient", mat.name);
      WriteTextureParamEntry( mat.diffuse, "diffuse", mat.name);
      WriteTextureParamEntry( mat.specular, "specular", mat.name);
      WriteTextureParamEntry( mat.reflective, "reflective", mat.name);
      WriteTextureParamEntry( mat.transparent, "transparent", mat.name);
      WriteTextureParamEntry( mat.normal, "normal", mat.name);

      mOutput << startstr << "<technique sid=\"standard\">" << endstr;
      PushTag();
      mOutput << startstr << "<" << mat.shading_model << ">" << endstr;
      PushTag();

      WriteTextureColorEntry( mat.emissive, "emission", mat.name + "-emission-sampler");
      WriteTextureColorEntry( mat.ambient, "ambient", mat.name + "-ambient-sampler");
      WriteTextureColorEntry( mat.diffuse, "diffuse", mat.name + "-diffuse-sampler");
      WriteTextureColorEntry( mat.specular, "specular", mat.name + "-specular-sampler");
      WriteFloatEntry(mat.shininess, "shininess");
      WriteTextureColorEntry( mat.reflective, "reflective", mat.name + "-reflective-sampler");
      WriteTextureColorEntry( mat.transparent, "transparent", mat.name + "-transparent-sampler");
      WriteFloatEntry(mat.transparency, "transparency");
      WriteFloatEntry(mat.index_refraction, "index_of_refraction");

      if(! mat.normal.texture.empty()) {
        WriteTextureColorEntry( mat.normal, "bump", mat.name + "-normal-sampler");
      }

      PopTag();
      mOutput << startstr << "</" << mat.shading_model << ">" << endstr;
      PopTag();
      mOutput << startstr << "</technique>" << endstr;
      PopTag();
      mOutput << startstr << "</profile_COMMON>" << endstr;
      PopTag();
      mOutput << startstr << "</effect>" << endstr;
    }
    PopTag();
    mOutput << startstr << "</library_effects>" << endstr;

    // write materials - they're just effect references
    mOutput << startstr << "<library_materials>" << endstr;
    PushTag();
    for( std::vector<Material>::const_iterator it = materials.begin(); it != materials.end(); ++it )
    {
      const Material& mat = *it;
      mOutput << startstr << "<material id=\"" << XMLEscape(mat.name) << "\" name=\"" << mat.name << "\">" << endstr;
      PushTag();
      mOutput << startstr << "<instance_effect url=\"#" << XMLEscape(mat.name) << "-fx\"/>" << endstr;
      PopTag();
      mOutput << startstr << "</material>" << endstr;
    }
    PopTag();
    mOutput << startstr << "</library_materials>" << endstr;
  }
}